

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_loggedin(Curl_easy *data)

{
  anon_union_248_5_a113b5f6_for_proto *pp;
  CURLcode CVar1;
  ftpstate fVar2;
  
  pp = &data->conn->proto;
  if (((data->conn->bits).field_0x6 & 0x20) == 0) {
    CVar1 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","PWD");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PWD;
  }
  else {
    CVar1 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PBSZ %d",0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PBSZ;
  }
  (data->conn->proto).ftpc.state = fVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_loggedin(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(conn->bits.ftp_use_control_ssl) {
    /* PBSZ = PROTECTION BUFFER SIZE.

    The 'draft-murray-auth-ftp-ssl' (draft 12, page 7) says:

    Specifically, the PROT command MUST be preceded by a PBSZ
    command and a PBSZ command MUST be preceded by a successful
    security data exchange (the TLS negotiation in this case)

    ... (and on page 8):

    Thus the PBSZ command must still be issued, but must have a
    parameter of '0' to indicate that no buffering is taking place
    and the data connection should not be encapsulated.
    */
    result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "PBSZ %d", 0);
    if(!result)
      state(data, FTP_PBSZ);
  }
  else {
    result = ftp_state_pwd(data, conn);
  }
  return result;
}